

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_stor_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  ftp_conn *ftpc;
  SessionHandle *pSStack_30;
  _Bool connected;
  SessionHandle *data;
  ftpstate local_20;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  pSStack_30 = conn->data;
  local_20 = instate;
  result = ftpcode;
  _instate_local = conn;
  if (ftpcode < 400) {
    (conn->proto).ftpc.state_saved = instate;
    if (((pSStack_30->set).ftp_use_port & 1U) == 0) {
      conn_local._4_4_ = InitiateTransfer(conn);
    }
    else {
      _state(conn,FTP_STOP);
      data._4_4_ = AllowServerConnect(_instate_local,(_Bool *)((long)&ftpc + 7));
      pcVar1 = _instate_local;
      conn_local._4_4_ = data._4_4_;
      if (data._4_4_ == CURLE_OK) {
        if ((ftpc._7_1_ & 1) == 0) {
          Curl_infof(pSStack_30,"Data conn was not available immediately\n");
          (pcVar1->proto).ftpc.wait_data_conn = true;
        }
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  else {
    Curl_failf(pSStack_30,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
    _state(_instate_local,FTP_STOP);
    conn_local._4_4_ = CURLE_UPLOAD_FAILED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_stor_resp(struct connectdata *conn,
                                    int ftpcode, ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  if(ftpcode>=400) {
    failf(data, "Failed FTP upload: %0d", ftpcode);
    state(conn, FTP_STOP);
    /* oops, we never close the sockets! */
    return CURLE_UPLOAD_FAILED;
  }

  conn->proto.ftpc.state_saved = instate;

  /* PORT means we are now awaiting the server to connect to us. */
  if(data->set.ftp_use_port) {
    bool connected;

    state(conn, FTP_STOP); /* no longer in STOR state */

    result = AllowServerConnect(conn, &connected);
    if(result)
      return result;

    if(!connected) {
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      infof(data, "Data conn was not available immediately\n");
      ftpc->wait_data_conn = TRUE;
    }

    return CURLE_OK;
  }
  else
    return InitiateTransfer(conn);
}